

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geofile_operations.cpp
# Opt level: O0

geo_argument GEO::hashit(string *inString)

{
  bool bVar1;
  string *inString_local;
  
  bVar1 = std::operator==(inString,"Point");
  if (bVar1) {
    inString_local._4_4_ = ePoint;
  }
  else {
    bVar1 = std::operator==(inString,"cl__1");
    if (bVar1) {
      inString_local._4_4_ = eChar_Len;
    }
    else {
      bVar1 = std::operator==(inString,"Line");
      if (bVar1) {
        inString_local._4_4_ = eLine;
      }
      else {
        bVar1 = std::operator==(inString,"Line Loop");
        if (bVar1) {
          inString_local._4_4_ = eCurve_Loop;
        }
        else {
          bVar1 = std::operator==(inString,"Curve Loop");
          if (bVar1) {
            inString_local._4_4_ = eCurve_Loop;
          }
          else {
            bVar1 = std::operator==(inString,"Plane Surface");
            if (bVar1) {
              inString_local._4_4_ = ePlane_surface;
            }
            else {
              bVar1 = std::operator==(inString,"Surface");
              if (bVar1) {
                inString_local._4_4_ = ePlane_surface;
              }
              else {
                bVar1 = std::operator==(inString,"Surface Loop");
                if (bVar1) {
                  inString_local._4_4_ = eSurface_loop;
                }
                else {
                  bVar1 = std::operator==(inString,"Volume");
                  if (bVar1) {
                    inString_local._4_4_ = eVolume;
                  }
                  else {
                    bVar1 = std::operator==(inString,"Physical Point");
                    if (bVar1) {
                      inString_local._4_4_ = ePhysical_Point;
                    }
                    else {
                      bVar1 = std::operator==(inString,"Physical Line");
                      if (bVar1) {
                        inString_local._4_4_ = ePhysical_Curve;
                      }
                      else {
                        bVar1 = std::operator==(inString,"Physical Curve");
                        if (bVar1) {
                          inString_local._4_4_ = ePhysical_Curve;
                        }
                        else {
                          bVar1 = std::operator==(inString,"Physical Surface");
                          if (bVar1) {
                            inString_local._4_4_ = ePhysical_Surface;
                          }
                          else {
                            bVar1 = std::operator==(inString,"Physical Volume");
                            if (bVar1) {
                              inString_local._4_4_ = ePhysical_Volume;
                            }
                            else {
                              bVar1 = std::operator==(inString,"MeshSpac");
                              if (bVar1) {
                                inString_local._4_4_ = eMesh_Spacing;
                              }
                              else {
                                bVar1 = std::operator==(inString,"SetFactory");
                                if (bVar1) {
                                  inString_local._4_4_ = eOpenCASCADE;
                                }
                                else {
                                  bVar1 = std::operator==(inString,"");
                                  if (bVar1) {
                                    inString_local._4_4_ = eBlank_Space;
                                  }
                                  else {
                                    inString_local._4_4_ = eDefault;
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return inString_local._4_4_;
}

Assistant:

GEO::geo_argument GEO::hashit(std::string const& inString)
{
    if (inString == "Point")            return GEO::ePoint;
    if (inString == "cl__1")            return GEO::eChar_Len;
    if (inString == "Line")             return GEO::eLine;
    if (inString == "Line Loop")        return GEO::eCurve_Loop;
    if (inString == "Curve Loop")       return GEO::eCurve_Loop;
    if (inString == "Plane Surface")    return GEO::ePlane_surface;
    if (inString == "Surface")          return GEO::ePlane_surface;
    if (inString == "Surface Loop")     return GEO::eSurface_loop;
    if (inString == "Volume")           return GEO::eVolume;
    if (inString == "Physical Point")   return GEO::ePhysical_Point;
    if (inString == "Physical Line")    return GEO::ePhysical_Curve;
    if (inString == "Physical Curve")   return GEO::ePhysical_Curve;
    if (inString == "Physical Surface") return GEO::ePhysical_Surface;
    if (inString == "Physical Volume")  return GEO::ePhysical_Volume;
    if (inString == "MeshSpac")         return GEO::eMesh_Spacing;
    if (inString == "SetFactory")       return GEO::eOpenCASCADE;
    if (inString == "")                 return GEO::eBlank_Space;
    return GEO::eDefault;
}